

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.h
# Opt level: O0

float Ptex::v2_2::PtexUtils::reciprocalPow2(int power)

{
  float f;
  int power_local;
  
  return (float)((0x7f - power) * 0x800000);
}

Assistant:

inline float reciprocalPow2(int power)
{
    // 1.0/pow(2,power)
    union {
        float f;
        int32_t i;
    };
    i = (127-power)<<23;
    return f;
}